

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_delete.cpp
# Opt level: O1

void __thiscall
duckdb::DeleteLocalState::DeleteLocalState
          (DeleteLocalState *this,ClientContext *context,TableCatalogEntry *table,
          vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_true>
          *bound_constraints)

{
  unique_ptr<duckdb::TableDeleteState,_std::default_delete<duckdb::TableDeleteState>,_true> *this_00
  ;
  _Tuple_impl<0UL,_duckdb::TableDeleteState_*,_std::default_delete<duckdb::TableDeleteState>_>
  __ptr_00;
  vector<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_> *pvVar1;
  undefined1 auVar2 [8];
  int iVar3;
  Allocator *allocator;
  undefined4 extraout_var;
  pointer *__ptr;
  vector<bool,_true> initialize;
  allocator_type local_79;
  undefined1 local_78 [8];
  vector<bool,_true> local_70;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_48;
  
  *(undefined4 *)&(this->super_LocalSinkState).partition_info.batch_index.index = 0xffffffff;
  *(undefined4 *)((long)&(this->super_LocalSinkState).partition_info.batch_index.index + 4) =
       0xffffffff;
  *(undefined4 *)&(this->super_LocalSinkState).partition_info.min_batch_index.index = 0xffffffff;
  *(undefined4 *)((long)&(this->super_LocalSinkState).partition_info.min_batch_index.index + 4) =
       0xffffffff;
  pvVar1 = &(this->super_LocalSinkState).partition_info.partition_data.
            super_vector<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>;
  (pvVar1->
  super__Vector_base<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pvVar1->
  super__Vector_base<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_LocalSinkState).partition_info.partition_data.
  super_vector<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>.
  super__Vector_base<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_LocalSinkState)._vptr_LocalSinkState = (_func_int **)&PTR__DeleteLocalState_019c6850;
  DataChunk::DataChunk(&this->delete_chunk);
  this_00 = &this->delete_state;
  (this->delete_state).
  super_unique_ptr<duckdb::TableDeleteState,_std::default_delete<duckdb::TableDeleteState>_>._M_t.
  super___uniq_ptr_impl<duckdb::TableDeleteState,_std::default_delete<duckdb::TableDeleteState>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::TableDeleteState_*,_std::default_delete<duckdb::TableDeleteState>_>
  .super__Head_base<0UL,_duckdb::TableDeleteState_*,_false>._M_head_impl = (TableDeleteState *)0x0;
  TableCatalogEntry::GetTypes((vector<duckdb::LogicalType,_true> *)&local_48,table);
  local_78 = (undefined1  [8])((ulong)local_78 & 0xffffffffffffff00);
  ::std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)&local_70,
             ((long)local_48.
                    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)local_48.
                    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555,
             (bool *)local_78,&local_79);
  allocator = Allocator::Get(context);
  DataChunk::Initialize
            (&this->delete_chunk,allocator,(vector<duckdb::LogicalType,_true> *)&local_48,&local_70,
             0x800);
  iVar3 = (*(table->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry._vptr_CatalogEntry
            [0x10])(table);
  DataTable::InitializeDelete
            ((DataTable *)local_78,(TableCatalogEntry *)CONCAT44(extraout_var,iVar3),
             (ClientContext *)table,
             (vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_true>
              *)context);
  auVar2 = local_78;
  local_78 = (undefined1  [8])0x0;
  __ptr_00.super__Head_base<0UL,_duckdb::TableDeleteState_*,_false>._M_head_impl =
       (this_00->
       super_unique_ptr<duckdb::TableDeleteState,_std::default_delete<duckdb::TableDeleteState>_>).
       _M_t.
       super___uniq_ptr_impl<duckdb::TableDeleteState,_std::default_delete<duckdb::TableDeleteState>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::TableDeleteState_*,_std::default_delete<duckdb::TableDeleteState>_>
       .super__Head_base<0UL,_duckdb::TableDeleteState_*,_false>;
  (this_00->
  super_unique_ptr<duckdb::TableDeleteState,_std::default_delete<duckdb::TableDeleteState>_>)._M_t.
  super___uniq_ptr_impl<duckdb::TableDeleteState,_std::default_delete<duckdb::TableDeleteState>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::TableDeleteState_*,_std::default_delete<duckdb::TableDeleteState>_>
  .super__Head_base<0UL,_duckdb::TableDeleteState_*,_false> =
       (_Head_base<0UL,_duckdb::TableDeleteState_*,_false>)auVar2;
  if (__ptr_00.super__Head_base<0UL,_duckdb::TableDeleteState_*,_false>._M_head_impl !=
      (TableDeleteState *)0x0) {
    ::std::default_delete<duckdb::TableDeleteState>::operator()
              ((default_delete<duckdb::TableDeleteState> *)this_00,
               (TableDeleteState *)
               __ptr_00.super__Head_base<0UL,_duckdb::TableDeleteState_*,_false>._M_head_impl);
  }
  if (local_78 != (undefined1  [8])0x0) {
    ::std::default_delete<duckdb::TableDeleteState>::operator()
              ((default_delete<duckdb::TableDeleteState> *)local_78,(TableDeleteState *)local_78);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_70.super_vector<bool,_std::allocator<bool>_>.super__Bvector_base<std::allocator<bool>_>.
      _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    operator_delete(local_70.super_vector<bool,_std::allocator<bool>_>.
                    super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                    _M_start.super__Bit_iterator_base._M_p);
    local_70.super_vector<bool,_std::allocator<bool>_>.super__Bvector_base<std::allocator<bool>_>.
    _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_70.super_vector<bool,_std::allocator<bool>_>.super__Bvector_base<std::allocator<bool>_>.
    _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
    local_70.super_vector<bool,_std::allocator<bool>_>.super__Bvector_base<std::allocator<bool>_>.
    _M_impl.super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_70.super_vector<bool,_std::allocator<bool>_>.super__Bvector_base<std::allocator<bool>_>.
    _M_impl.super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
    local_70.super_vector<bool,_std::allocator<bool>_>.super__Bvector_base<std::allocator<bool>_>.
    _M_impl.super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
  }
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_48);
  return;
}

Assistant:

DeleteLocalState(ClientContext &context, TableCatalogEntry &table,
	                 const vector<unique_ptr<BoundConstraint>> &bound_constraints) {
		const auto &types = table.GetTypes();
		auto initialize = vector<bool>(types.size(), false);
		delete_chunk.Initialize(Allocator::Get(context), types, initialize);

		auto &storage = table.GetStorage();
		delete_state = storage.InitializeDelete(table, context, bound_constraints);
	}